

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int * Dau_DsdComputeMatches(char *p)

{
  byte bVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  uint uVar7;
  int pNested [12];
  int local_38 [14];
  
  if (*p != '\0') {
    lVar2 = 0;
    piVar3 = Dau_DsdComputeMatches::pMatches;
    iVar4 = 0;
    do {
      *piVar3 = 0;
      bVar1 = p[lVar2];
      uVar7 = bVar1 - 0x28;
      if (uVar7 < 0x36) {
        if ((0x8000000100001U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
          if ((0x20000000400002U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_00494ade;
          goto LAB_00494af6;
        }
LAB_00494aea:
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + 1;
        piVar6 = local_38 + lVar5;
LAB_00494b05:
        *piVar6 = (int)lVar2;
      }
      else {
LAB_00494ade:
        if (bVar1 == 0x7d) {
LAB_00494af6:
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + -1;
          piVar6 = Dau_DsdComputeMatches::pMatches + local_38[lVar5 + -1];
          goto LAB_00494b05;
        }
        if (bVar1 == 0x7b) goto LAB_00494aea;
      }
      if (0xb < iVar4) {
        __assert_fail("nNested < DAU_MAX_VAR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x5c,"int *Dau_DsdComputeMatches(char *)");
      }
      piVar3 = piVar3 + 1;
      lVar5 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (p[lVar5] != '\0');
    if (iVar4 != 0) {
      __assert_fail("nNested == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x5e,"int *Dau_DsdComputeMatches(char *)");
    }
  }
  return Dau_DsdComputeMatches::pMatches;
}

Assistant:

int * Dau_DsdComputeMatches( char * p )
{
    static int pMatches[DAU_MAX_STR];
    int pNested[DAU_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DAU_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}